

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_append(char **destination,char *append)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *tmp;
  size_t result_size;
  size_t append_size;
  size_t destination_size;
  char *append_local;
  char **destination_local;
  
  sVar1 = strlen(*destination);
  sVar2 = strlen(append);
  pcVar3 = (char *)realloc(*destination,sVar1 + sVar2 + 1);
  if (pcVar3 == (char *)0x0) {
    free(*destination);
    destination_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    *destination = pcVar3;
    strncpy(*destination + sVar1,append,sVar2 + 1);
    destination_local._4_4_ = NO_ERROR;
  }
  return destination_local._4_4_;
}

Assistant:

natwm_error string_append(char **destination, const char *append)
{
        size_t destination_size = strlen(*destination);
        size_t append_size = strlen(append) + 1;
        size_t result_size = destination_size + append_size;
        char *tmp = realloc(*destination, result_size);

        if (tmp == NULL) {
                free(*destination);

                return MEMORY_ALLOCATION_ERROR;
        }

        *destination = tmp;

        strncpy(*destination + destination_size, append, append_size);

        return NO_ERROR;
}